

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O1

ion_err_t flat_file_scan(ion_flat_file_t *flat_file,ion_fpos_t start_location,ion_fpos_t *location,
                        ion_flat_file_row_t *row,ion_byte_t scan_direction,
                        ion_flat_file_predicate_t predicate,...)

{
  ulong uVar1;
  ion_byte_t *piVar2;
  char in_AL;
  ion_boolean_t iVar3;
  int iVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  ion_flat_file_row_status_t *piVar8;
  size_t sVar9;
  long lVar10;
  char cVar11;
  ulong __n;
  bool bVar12;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list predicate_arguments;
  ulong local_138;
  long local_130;
  long local_128;
  __va_list_tag local_108;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  cVar11 = (char)_scan_direction;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  lVar7 = flat_file->start_of_data;
  local_128 = lVar7;
  if (_scan_direction == 1) {
    local_128 = flat_file->eof_position;
  }
  lVar10 = 0;
  if (start_location != -1) {
    lVar10 = flat_file->row_size * start_location;
  }
  if (start_location == -1 && cVar11 != '\x01') {
    lVar10 = flat_file->eof_position;
  }
  else {
    lVar10 = lVar10 + lVar7;
  }
  if (cVar11 == '\0') {
    sVar9 = flat_file->row_size;
    if (lVar10 == flat_file->eof_position) {
      sVar9 = 0;
    }
    lVar10 = lVar10 + sVar9;
  }
  local_138._0_1_ = '\x13';
  if (lVar7 <= lVar10 && lVar10 <= flat_file->eof_position) {
    uVar1 = (ulong)(cVar11 == '\x01') * 2 - 1;
    local_138 = uVar1;
    do {
      if (local_128 - lVar10 == 0) {
        *location = (ulong)(flat_file->eof_position - flat_file->start_of_data) /
                    flat_file->row_size;
        return '\x0e';
      }
      iVar4 = fseek((FILE *)flat_file->data_file,lVar10,0);
      if (iVar4 != 0) {
        return '\r';
      }
      __n = (ulong)flat_file->num_buffered;
      if (cVar11 == '\x01') {
        bVar12 = false;
        uVar5 = (ulong)(local_128 - lVar10) / flat_file->row_size;
        if (uVar5 < __n) {
          __n = uVar5;
        }
        sVar6 = fread(flat_file->buffer,flat_file->row_size,__n,(FILE *)flat_file->data_file);
        if (__n == sVar6) {
          local_130 = ftell((FILE *)flat_file->data_file);
          bVar12 = local_130 != -1;
          local_138 = local_138 & 0xff;
          if (!bVar12) {
            local_138 = 8;
          }
        }
        else {
          local_138 = 8;
          local_130 = lVar10;
        }
        if (bVar12) {
LAB_00105dc5:
          iVar4 = (int)__n + -1;
          if (cVar11 == '\x01') {
            iVar4 = 0;
          }
          uVar5 = (ulong)iVar4;
          bVar12 = uVar5 < __n;
          if (cVar11 != '\x01') {
            bVar12 = -1 < iVar4;
          }
          flat_file->current_loaded_region =
               (ulong)(lVar10 - flat_file->start_of_data) / flat_file->row_size;
          flat_file->num_in_buffer = __n;
          if (bVar12) {
            do {
              lVar7 = flat_file->row_size * uVar5;
              piVar2 = flat_file->buffer;
              piVar8 = piVar2 + lVar7;
              row->row_status = *piVar8;
              row->key = piVar8 + 1;
              row->value = piVar2 + (long)(flat_file->super).record.key_size + 1 + lVar7;
              local_108.reg_save_area = local_e8;
              local_108.overflow_arg_area = &stack0x00000008;
              local_108.gp_offset = 0x30;
              local_108.fp_offset = 0x30;
              iVar3 = (*predicate)(flat_file,row,(va_list *)&local_108);
              if (iVar3 != '\0') {
                local_138 = 0;
                *location = (ulong)(lVar10 - flat_file->start_of_data) / flat_file->row_size + uVar5
                ;
                break;
              }
              uVar5 = uVar5 + uVar1;
              bVar12 = uVar5 < __n;
              if (cVar11 != '\x01') {
                bVar12 = -1 < (long)uVar5;
              }
            } while (bVar12);
          }
          bVar12 = (bool)(bVar12 ^ 1);
          lVar10 = local_130;
        }
        else {
LAB_00105ed7:
          lVar10 = local_130;
          bVar12 = false;
        }
      }
      else {
        lVar7 = flat_file->start_of_data;
        lVar10 = lVar10 - flat_file->row_size * __n;
        if (lVar7 - lVar10 != 0 && lVar10 <= lVar7) {
          __n = __n - (ulong)(lVar7 - lVar10) / flat_file->row_size;
          lVar10 = lVar7;
        }
        bVar12 = false;
        iVar4 = fseek((FILE *)flat_file->data_file,lVar10,0);
        if (iVar4 == 0) {
          sVar6 = fread(flat_file->buffer,flat_file->row_size,__n,(FILE *)flat_file->data_file);
          local_130 = lVar10;
          if (__n != sVar6) {
            local_138 = 8;
            goto LAB_00105ed7;
          }
          goto LAB_00105dc5;
        }
        local_138 = 0xd;
      }
    } while (bVar12);
  }
  return (ion_err_t)local_138;
}

Assistant:

ion_err_t
flat_file_scan(
	ion_flat_file_t				*flat_file,
	ion_fpos_t					start_location,
	ion_fpos_t					*location,
	ion_flat_file_row_t			*row,
	ion_byte_t					scan_direction,
	ion_flat_file_predicate_t	predicate,
	...
) {
	ion_fpos_t	cur_offset	= flat_file->start_of_data + start_location * flat_file->row_size;
	ion_fpos_t	end_offset	= ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? flat_file->eof_position : flat_file->start_of_data;

	if (-1 == start_location) {
		if (ION_FLAT_FILE_SCAN_FORWARDS == scan_direction) {
			cur_offset = flat_file->start_of_data;
		}
		else {
			cur_offset = flat_file->eof_position;
		}
	}

	/* If we're scanning backwards, bump the cur_offset up one record so that we read the record we're sitting on. */
	/* We don't do this if we're positioned at the EOF, since otherwise we would read garbage. */
	if ((ION_FLAT_FILE_SCAN_BACKWARDS == scan_direction) && (cur_offset != flat_file->eof_position)) {
		cur_offset += flat_file->row_size;
	}

	if ((cur_offset > flat_file->eof_position) || (cur_offset < flat_file->start_of_data)) {
		return err_out_of_bounds;
	}

	while (cur_offset != end_offset) {
		if (0 != fseek(flat_file->data_file, cur_offset, SEEK_SET)) {
			return err_file_bad_seek;
		}

		/* We set cur_offset to be the next block to read after this next code segment, so */
		/* we need t save what block we're currently reading now for location calculation purposes */
		ion_fpos_t	prev_offset				= cur_offset;
		size_t		num_records_to_process	= flat_file->num_buffered;

		if (ION_FLAT_FILE_SCAN_FORWARDS == scan_direction) {
			/* It's possible for this to do a partial read (if you're close to EOF), calculate how many we need to read */
			size_t records_left = (end_offset - cur_offset) / flat_file->row_size;

			num_records_to_process = records_left > (unsigned) flat_file->num_buffered ? (unsigned) flat_file->num_buffered : records_left;

			if (num_records_to_process != fread(flat_file->buffer, flat_file->row_size, num_records_to_process, flat_file->data_file)) {
				return err_file_read_error;
			}

			if (-1 == (cur_offset = ftell(flat_file->data_file))) {
				return err_file_read_error;
			}
		}
		else {
			/* Move the offset pointer to the next read location, clamp it at start_of_file if we go too far. */
			cur_offset -= flat_file->row_size * flat_file->num_buffered;

			if (cur_offset < flat_file->start_of_data) {
				/* We know how many rows we went past the start of file, calculate it so we don't fread too much */
				num_records_to_process	= flat_file->num_buffered - (flat_file->start_of_data - cur_offset) / flat_file->row_size;
				cur_offset				= flat_file->start_of_data;
			}

			if (0 != fseek(flat_file->data_file, cur_offset, SEEK_SET)) {
				return err_file_bad_seek;
			}

			if (num_records_to_process != fread(flat_file->buffer, flat_file->row_size, num_records_to_process, flat_file->data_file)) {
				return err_file_read_error;
			}

			/* In this case, the prev_offset is actually the cur_offset. */
			prev_offset = cur_offset;
		}

		flat_file->current_loaded_region	= (prev_offset - flat_file->start_of_data) / flat_file->row_size;
		flat_file->num_in_buffer			= num_records_to_process;

		int32_t i;

		for (i = ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? 0 : num_records_to_process - 1; ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? (size_t) i < num_records_to_process : i >= 0; ION_FLAT_FILE_SCAN_FORWARDS == scan_direction ? i++ : i--) {
			size_t cur_rec = i * flat_file->row_size;

			/* This cast is done because in the future, the status could possibly be a non-byte type */
			row->row_status = *((ion_flat_file_row_status_t *) &flat_file->buffer[cur_rec]);
			row->key		= &flat_file->buffer[cur_rec + sizeof(ion_flat_file_row_status_t)];
			row->value		= &flat_file->buffer[cur_rec + sizeof(ion_flat_file_row_status_t) + flat_file->super.record.key_size];

			va_list predicate_arguments;

			va_start(predicate_arguments, predicate);

			ion_boolean_t predicate_test = predicate(flat_file, row, &predicate_arguments);

			va_end(predicate_arguments);

			if (predicate_test) {
				*location = (prev_offset - flat_file->start_of_data) / flat_file->row_size + i;
				return err_ok;
			}
		}
	}

	/* If we reach this point, then no row matched the predicate. */
	*location = (flat_file->eof_position - flat_file->start_of_data) / flat_file->row_size;
	return err_file_hit_eof;
}